

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

uint32 ParticleColor(int rgb)

{
  byte bVar1;
  uint *puVar2;
  int stuff;
  int *val;
  int rgb_local;
  
  puVar2 = (uint *)TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::CheckKey(&ColorSaver,rgb);
  if (puVar2 == (uint *)0x0) {
    bVar1 = FColorMatcher::Pick(&ColorMatcher,rgb >> 0x10 & 0xff,rgb >> 8 & 0xff,rgb & 0xff);
    val._4_4_ = rgb | (uint)bVar1 << 0x18;
    puVar2 = (uint *)TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::operator[]
                               (&ColorSaver,rgb);
    *puVar2 = val._4_4_;
  }
  else {
    val._4_4_ = *puVar2;
  }
  return val._4_4_;
}

Assistant:

static uint32 ParticleColor(int rgb)
{
	int *val;
	int stuff;

	val = ColorSaver.CheckKey(rgb);
	if (val != NULL)
	{
		return *val;
	}
	stuff = rgb | (ColorMatcher.Pick(RPART(rgb), GPART(rgb), BPART(rgb)) << 24);
	ColorSaver[rgb] = stuff;
	return stuff;
}